

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O0

bool __thiscall VideoEngine::Framebuffer::attachColorTexture(Framebuffer *this,int i,Texture *tex)

{
  int iVar1;
  GLuint GVar2;
  int status;
  Texture *tex_local;
  int i_local;
  Framebuffer *this_local;
  
  iVar1 = Texture::w(tex);
  this->w = iVar1;
  iVar1 = Texture::h(tex);
  this->h = iVar1;
  GVar2 = Texture::name(tex);
  glFramebufferTexture2D(0x8d40,i + 0x8ce0,0xde1,GVar2,0);
  GLCHECK(
         "glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_TEXTURE_2D, tex.name(), 0)"
         );
  iVar1 = glCheckFramebufferStatus(0x8d40);
  return iVar1 == 0x8cd5;
}

Assistant:

bool VideoEngine::Framebuffer::attachColorTexture(int i, const Texture &tex) {
	// FIXME check?
	w = tex.w();
	h = tex.h();
	GL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_TEXTURE_2D, tex.name(), 0));

	const int status = glCheckFramebufferStatus(GL_FRAMEBUFFER);
	return status == GL_FRAMEBUFFER_COMPLETE;
}